

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SpatialSort::Append
          (SpatialSort *this,aiVector3D *pPositions,uint pNumPositions,uint pElementOffset,
          bool pFinalize)

{
  uint local_7c;
  Entry local_60;
  float local_4c;
  aiVector3t<float> *paStack_48;
  ai_real distance;
  aiVector3D *vec;
  char *tempPointer;
  size_type sStack_30;
  uint a;
  size_t initial;
  uint local_20;
  uint uStack_1c;
  bool pFinalize_local;
  uint pElementOffset_local;
  uint pNumPositions_local;
  aiVector3D *pPositions_local;
  SpatialSort *this_local;
  
  initial._7_1_ = pFinalize;
  local_20 = pElementOffset;
  uStack_1c = pNumPositions;
  _pElementOffset_local = pPositions;
  pPositions_local = &this->mPlaneNormal;
  sStack_30 = std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
              size(&this->mPositions);
  if ((initial._7_1_ & 1) == 0) {
    local_7c = uStack_1c << 1;
  }
  else {
    local_7c = uStack_1c;
  }
  std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::reserve
            (&this->mPositions,sStack_30 + local_7c);
  for (tempPointer._4_4_ = 0; tempPointer._4_4_ < uStack_1c;
      tempPointer._4_4_ = tempPointer._4_4_ + 1) {
    vec = _pElementOffset_local;
    paStack_48 = (aiVector3t<float> *)
                 ((long)&_pElementOffset_local->x + (ulong)(tempPointer._4_4_ * local_20));
    local_4c = ::operator*(paStack_48,&this->mPlaneNormal);
    Entry::Entry(&local_60,tempPointer._4_4_ + (int)sStack_30,paStack_48,local_4c);
    std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::push_back
              (&this->mPositions,&local_60);
  }
  if ((initial._7_1_ & 1) != 0) {
    Finalize(this);
  }
  return;
}

Assistant:

void SpatialSort::Append( const aiVector3D* pPositions, unsigned int pNumPositions,
    unsigned int pElementOffset,
    bool pFinalize /*= true */)
{
    // store references to all given positions along with their distance to the reference plane
    const size_t initial = mPositions.size();
    mPositions.reserve(initial + (pFinalize?pNumPositions:pNumPositions*2));
    for( unsigned int a = 0; a < pNumPositions; a++)
    {
        const char* tempPointer = reinterpret_cast<const char*> (pPositions);
        const aiVector3D* vec   = reinterpret_cast<const aiVector3D*> (tempPointer + a * pElementOffset);

        // store position by index and distance
        ai_real distance = *vec * mPlaneNormal;
        mPositions.push_back( Entry( static_cast<unsigned int>(a+initial), *vec, distance));
    }

    if (pFinalize) {
        // now sort the array ascending by distance.
        Finalize();
    }
}